

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_op_iwmmxt_andq_M0_wRn(TCGContext_conflict1 *tcg_ctx,int rn)

{
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i64,(TCGArg)(tcg_ctx->cpu_V1 + (long)tcg_ctx),
                      (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(uint)rn * 8 + 0x2f18);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_and_i64,(TCGArg)(tcg_ctx->cpu_M0 + (long)tcg_ctx),
                      (TCGArg)(tcg_ctx->cpu_M0 + (long)tcg_ctx),
                      (TCGArg)(tcg_ctx->cpu_V1 + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_op_iwmmxt_andq_M0_wRn(TCGContext *tcg_ctx, int rn)
{
    iwmmxt_load_reg(tcg_ctx, tcg_ctx->cpu_V1, rn);
    tcg_gen_and_i64(tcg_ctx, tcg_ctx->cpu_M0, tcg_ctx->cpu_M0, tcg_ctx->cpu_V1);
}